

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.h
# Opt level: O0

Index __thiscall wabt::BindingHash::FindIndex(BindingHash *this,string_view name)

{
  Index IVar1;
  allocator<char> local_41;
  string local_40;
  BindingHash *local_20;
  BindingHash *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (BindingHash *)name._M_len;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_41);
  IVar1 = FindIndex(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return IVar1;
}

Assistant:

Index FindIndex(std::string_view name) const {
    return FindIndex(std::string(name));
  }